

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

bool remove_handler(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                   ValueCallback *callback)

{
  _Elt_pointer ppVVar1;
  ValueCallback *pVVar2;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *__range1;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  _Elt_pointer ppVVar7;
  _Map_pointer pppVVar8;
  _Elt_pointer ppVVar9;
  iterator iStack_58;
  iterator local_38;
  
  local_38._M_cur =
       (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_38._M_node =
       (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  ppVVar1 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_38._M_cur == ppVVar1) {
    uVar3 = 0xffffffff;
  }
  else {
    ppVVar7 = (callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_last;
    uVar6 = 0;
    pppVVar8 = local_38._M_node;
    ppVVar9 = local_38._M_cur;
    do {
      pVVar2 = *ppVVar9;
      uVar3 = uVar6;
      if (pVVar2 == callback) break;
      ppVVar9 = ppVVar9 + 1;
      if (ppVVar9 == ppVVar7) {
        ppVVar9 = pppVVar8[1];
        pppVVar8 = pppVVar8 + 1;
        ppVVar7 = ppVVar9 + 0x40;
      }
      uVar6 = uVar6 + (pVVar2 != callback);
      uVar3 = 0xffffffff;
    } while (ppVVar9 != ppVVar1);
  }
  if (-1 < (int)uVar3) {
    uVar4 = ((long)local_38._M_cur -
             (long)(callbacks->super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>)
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (ulong)uVar3;
    if (uVar4 < 0x40) {
      local_38._M_cur = local_38._M_cur + uVar3;
    }
    else {
      uVar5 = uVar4 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar4) {
        uVar5 = uVar4 >> 6;
      }
      local_38._M_node = local_38._M_node + uVar5;
      local_38._M_cur = *local_38._M_node + uVar4 + uVar5 * -0x40;
    }
    local_38._M_first = *local_38._M_node;
    local_38._M_last = local_38._M_first + 0x40;
    std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::_M_erase
              (&iStack_58,callbacks,&local_38);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool remove_handler(std::deque<ValueCallback*>& callbacks, ValueCallback* callback){
    int i = 0;
    int found = -1;
    for(auto cb : callbacks){
        if(cb == callback){
            found = i;
            break;
        }
        i++;
    }

    if(found > -1){
        auto it = callbacks.begin();
        std::advance(it, found);
        callbacks.erase(it);
        return true;
    } else {
        return false;
    }
}